

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

bool __thiscall mocker::Token::partialCompare(Token *this,Token *rhs)

{
  element_type *peVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar5;
  undefined4 extraout_var_02;
  bool *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar8;
  __type _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> t1;
  string local_60 [32];
  string local_40 [32];
  
  peVar1 = (this->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar8 = (rhs->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0;
  if (peVar1 != (element_type *)0x0 && bVar8) {
    iVar3 = (*peVar1->_vptr_ValBase[2])();
    iVar4 = (*((rhs->valPtr).super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ValBase[2])();
    bVar8 = std::type_info::operator!=
                      ((type_info *)CONCAT44(extraout_var,iVar3),
                       (type_info *)CONCAT44(extraout_var_00,iVar4));
    if (bVar8) {
      _Var9 = false;
    }
    else {
      iVar3 = (*((this->valPtr).
                 super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_ValBase[2])();
      bVar8 = std::type_info::operator==
                        ((type_info *)CONCAT44(extraout_var_01,iVar3),(type_info *)&long::typeinfo);
      if (bVar8) {
        plVar5 = val<long>(this);
        lVar2 = *plVar5;
        plVar5 = val<long>(rhs);
        _Var9 = lVar2 == *plVar5;
      }
      else {
        iVar3 = (*((this->valPtr).
                   super___shared_ptr<mocker::Token::ValBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_ValBase[2])();
        bVar8 = std::type_info::operator==
                          ((type_info *)CONCAT44(extraout_var_02,iVar3),(type_info *)&bool::typeinfo
                          );
        if (bVar8) {
          pbVar6 = val<bool>(this);
          bVar8 = *pbVar6;
          pbVar6 = val<bool>(rhs);
          _Var9 = bVar8 == *pbVar6;
        }
        else {
          pbVar7 = val<std::__cxx11::string>(this);
          std::__cxx11::string::string(local_40,(string *)pbVar7);
          pbVar7 = val<std::__cxx11::string>(rhs);
          std::__cxx11::string::string(local_60,(string *)pbVar7);
          pbVar7 = val<std::__cxx11::string>(this);
          __rhs = val<std::__cxx11::string>(rhs);
          _Var9 = std::operator==(pbVar7,__rhs);
          std::__cxx11::string::~string(local_60);
          std::__cxx11::string::~string(local_40);
        }
      }
    }
  }
  else {
    _Var9 = (peVar1 != (element_type *)0x0) == bVar8;
  }
  return _Var9;
}

Assistant:

bool Token::partialCompare(const Token &rhs) const {
  if ((bool)valPtr ^ (bool)rhs.valPtr)
    return false;
  if (!valPtr)
    return true;

  if (type() != rhs.valPtr->type())
    return false;
  if (type() == typeid(Integer))
    return val<Integer>() == rhs.val<Integer>();
  if (type() == typeid(bool))
    return val<bool>() == rhs.val<bool>();
  auto t1 = val<std::string>();
  auto t2 = rhs.val<std::string>();
  return val<std::string>() == rhs.val<std::string>();
}